

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_thread_pool.h
# Opt level: O2

shared_ptr<simple_thread_pool::TaskHandle> __thiscall
simple_thread_pool::ThreadPoolMgr::getTaskToRun
          (ThreadPoolMgr *this,uint64_t *next_sleep_hint_us_inout)

{
  _func_int **pp_Var1;
  const_iterator __position;
  bool bVar2;
  iterator __position_00;
  ulong uVar3;
  ulong *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  shared_ptr<simple_thread_pool::TaskHandle> sVar5;
  uint64_t remaining_us;
  
  (this->super_ThreadPoolMgrBase)._vptr_ThreadPoolMgrBase = (_func_int **)0x0;
  this->MAX_SLEEP_US = 0;
  std::mutex::lock((mutex *)&((pthread_mutex_t *)(next_sleep_hint_us_inout + 0x17))->__data);
  __position_00._M_node = (_List_node_base *)next_sleep_hint_us_inout[0x14];
  while (__position_00._M_node != (_List_node_base *)(next_sleep_hint_us_inout + 0x14)) {
    remaining_us = 0;
    bVar2 = TaskHandle::timeToFire((TaskHandle *)__position_00._M_node[1]._M_next,&remaining_us);
    if (bVar2) {
      std::__shared_ptr<simple_thread_pool::TaskHandle,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<simple_thread_pool::TaskHandle,_(__gnu_cxx::_Lock_policy)2> *)this,
                 (__shared_ptr<simple_thread_pool::TaskHandle,_(__gnu_cxx::_Lock_policy)2> *)
                 (__position_00._M_node + 1));
      pp_Var1 = (this->super_ThreadPoolMgrBase)._vptr_ThreadPoolMgrBase;
      if ((*(int *)pp_Var1 == 0) || (*(int *)(pp_Var1 + 0xd) == 2)) {
        __position_00 =
             std::__cxx11::
             list<std::shared_ptr<simple_thread_pool::TaskHandle>,_std::allocator<std::shared_ptr<simple_thread_pool::TaskHandle>_>_>
             ::erase((list<std::shared_ptr<simple_thread_pool::TaskHandle>,_std::allocator<std::shared_ptr<simple_thread_pool::TaskHandle>_>_>
                      *)(next_sleep_hint_us_inout + 0x14),__position_00._M_node);
      }
      else {
        TaskHandle::reschedule
                  ((TaskHandle *)(this->super_ThreadPoolMgrBase)._vptr_ThreadPoolMgrBase,-1);
      }
      if (*(int *)((this->super_ThreadPoolMgrBase)._vptr_ThreadPoolMgrBase + 0xd) != 2) break;
      std::__shared_ptr<simple_thread_pool::TaskHandle,_(__gnu_cxx::_Lock_policy)2>::reset
                ((__shared_ptr<simple_thread_pool::TaskHandle,_(__gnu_cxx::_Lock_policy)2> *)this);
    }
    if (((this->super_ThreadPoolMgrBase)._vptr_ThreadPoolMgrBase == (_func_int **)0x0) &&
       (__position_00._M_node = (__position_00._M_node)->_M_next, in_RDX != (ulong *)0x0)) {
      uVar3 = *in_RDX;
      if (remaining_us < *in_RDX) {
        uVar3 = remaining_us;
      }
      *in_RDX = uVar3;
      if (next_sleep_hint_us_inout[1] < uVar3) {
        uVar3 = next_sleep_hint_us_inout[1];
      }
      *in_RDX = uVar3;
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)(next_sleep_hint_us_inout + 0x17));
  _Var4._M_pi = extraout_RDX;
  if ((this->super_ThreadPoolMgrBase)._vptr_ThreadPoolMgrBase == (_func_int **)0x0) {
    std::mutex::lock((mutex *)&((pthread_mutex_t *)(next_sleep_hint_us_inout + 0x1f))->__data);
    __position._M_node = (_List_node_base *)next_sleep_hint_us_inout[0x1c];
    if (__position._M_node != (_List_node_base *)(next_sleep_hint_us_inout + 0x1c)) {
      std::__shared_ptr<simple_thread_pool::TaskHandle,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<simple_thread_pool::TaskHandle,_(__gnu_cxx::_Lock_policy)2> *)this,
                 (__shared_ptr<simple_thread_pool::TaskHandle,_(__gnu_cxx::_Lock_policy)2> *)
                 (__position._M_node + 1));
      std::__cxx11::
      list<std::shared_ptr<simple_thread_pool::TaskHandle>,_std::allocator<std::shared_ptr<simple_thread_pool::TaskHandle>_>_>
      ::erase((list<std::shared_ptr<simple_thread_pool::TaskHandle>,_std::allocator<std::shared_ptr<simple_thread_pool::TaskHandle>_>_>
               *)(next_sleep_hint_us_inout + 0x1c),__position);
    }
    if ((in_RDX != (ulong *)0x0) && (next_sleep_hint_us_inout[0x1e] != 0)) {
      *in_RDX = 0;
    }
    pthread_mutex_unlock((pthread_mutex_t *)(next_sleep_hint_us_inout + 0x1f));
    _Var4._M_pi = extraout_RDX_00;
  }
  sVar5.super___shared_ptr<simple_thread_pool::TaskHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var4._M_pi;
  sVar5.super___shared_ptr<simple_thread_pool::TaskHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<simple_thread_pool::TaskHandle>)
         sVar5.super___shared_ptr<simple_thread_pool::TaskHandle,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<TaskHandle> getTaskToRun
                                (uint64_t* next_sleep_hint_us_inout = nullptr)
    {
        // Check timer task first (higher priority).
        std::shared_ptr<TaskHandle> task_to_run = nullptr;
        {   std::lock_guard<std::mutex> l(timedTasksLock);
            auto entry = timedTasks.begin();
            while (entry != timedTasks.end()) {
                std::shared_ptr<TaskHandle>& tt = *entry;
                uint64_t remaining_us = 0;
                if (tt->timeToFire(remaining_us)) {
                    task_to_run = tt;
                    if ( task_to_run->isOneTime() ||
                         task_to_run->isDone() ) {
                        entry = timedTasks.erase(entry);
                    } else {
                        task_to_run->reschedule();
                    }

                    if (task_to_run->isDone()) task_to_run.reset();
                    else break;
                }
                if (!task_to_run) {
                    entry++;
                    // Adjust next sleep time.
                    if (next_sleep_hint_us_inout) {
                        *next_sleep_hint_us_inout = std::min(*next_sleep_hint_us_inout,
                                                             remaining_us);
                        *next_sleep_hint_us_inout = std::min(*next_sleep_hint_us_inout,
                                                             MAX_SLEEP_US);
                    }
                }
            }
        }

        if (!task_to_run) {
            // If there is no timer task to be fired for now,
            // pick a normal task.
            std::lock_guard<std::mutex> l(normalTasksLock);
            auto entry = normalTasks.begin();
            if (entry != normalTasks.end()) {
                task_to_run = *entry;
                normalTasks.erase(entry);
            }

            if (normalTasks.size()) {
                // Still have pending task(s). Do not sleep.
                if (next_sleep_hint_us_inout) {
                    *next_sleep_hint_us_inout = 0;
                }
            }
        }
        return task_to_run;
    }